

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall
duckdb::DataTable::AddIndex
          (DataTable *this,ColumnList *columns,vector<duckdb::LogicalIndex,_true> *column_indexes,
          IndexConstraintType type,IndexStorageInfo *index_info)

{
  pointer pLVar1;
  AttachedDatabase *db;
  ColumnDefinition *this_00;
  string *args;
  LogicalType *args_1;
  DataTableInfo *pDVar2;
  type table_io_manager;
  ART *this_01;
  TransactionException *this_02;
  pointer pLVar3;
  _Head_base<0UL,_duckdb::Index_*,_false> local_f0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e8;
  Expression *local_e0;
  vector<unsigned_long,_true> physical_ids;
  ColumnBinding binding;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  string local_70;
  string local_50;
  
  if ((this->version)._M_i == MAIN_TABLE) {
    physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pLVar3 = (column_indexes->
             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_start;
    pLVar1 = (column_indexes->
             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (pLVar3 != pLVar1) {
      do {
        binding.column_index =
             (long)physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
        binding.table_index = 0;
        this_00 = ColumnList::GetColumn(columns,(LogicalIndex)pLVar3->index);
        args = ColumnDefinition::Name_abi_cxx11_(this_00);
        args_1 = ColumnDefinition::Type(this_00);
        make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::ColumnBinding&>
                  ((duckdb *)&local_e0,args,args_1,&binding);
        local_e8._M_head_impl = local_e0;
        local_e0 = (Expression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&expressions,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_e8);
        if (local_e8._M_head_impl != (Expression *)0x0) {
          (*((local_e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_e8._M_head_impl = (Expression *)ColumnDefinition::Physical(this_00);
        if (physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     (iterator)
                     physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(unsigned_long *)&local_e8);
        }
        else {
          *physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_e8._M_head_impl;
          physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_e0 != (Expression *)0x0) {
          (*(local_e0->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        pLVar3 = pLVar3 + 1;
      } while (pLVar3 != pLVar1);
    }
    pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
    table_io_manager =
         shared_ptr<duckdb::TableIOManager,_true>::operator*(&pDVar2->table_io_manager);
    db = this->db;
    this_01 = (ART *)operator_new(0x1a0);
    binding.table_index = 0;
    binding.column_index = 0;
    ART::ART(this_01,&index_info->name,type,&physical_ids,table_io_manager,&expressions,db,
             (shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
              *)&binding,index_info);
    if (binding.column_index != 0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)binding.column_index);
    }
    pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
    local_f0._M_head_impl = (Index *)this_01;
    TableIndexList::AddIndex
              (&pDVar2->indexes,
               (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)&local_f0);
    if ((ART *)local_f0._M_head_impl != (ART *)0x0) {
      (*(((BoundIndex *)&(local_f0._M_head_impl)->_vptr_Index)->super_Index)._vptr_Index[1])();
    }
    local_f0._M_head_impl = (Index *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             );
    if (physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  this_02 = (TransactionException *)__cxa_allocate_exception(0x10);
  physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&physical_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&physical_ids,
             "Transaction conflict: attempting to add an index to table \"%s\" but it has been %s by a different transaction"
             ,"");
  pDVar2 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  DataTableInfo::GetTableName_abi_cxx11_(&local_50,pDVar2);
  TableModification_abi_cxx11_(&local_70,this);
  TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
            (this_02,(string *)&physical_ids,&local_50,&local_70);
  __cxa_throw(this_02,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DataTable::AddIndex(const ColumnList &columns, const vector<LogicalIndex> &column_indexes,
                         const IndexConstraintType type, const IndexStorageInfo &index_info) {
	if (!IsMainTable()) {
		throw TransactionException("Transaction conflict: attempting to add an index to table \"%s\" but it has been "
		                           "%s by a different transaction",
		                           GetTableName(), TableModification());
	}

	// Fetch the column types and create bound column reference expressions.
	vector<column_t> physical_ids;
	vector<unique_ptr<Expression>> expressions;

	for (const auto column_index : column_indexes) {
		auto binding = ColumnBinding(0, physical_ids.size());
		auto &col = columns.GetColumn(column_index);
		auto ref = make_uniq<BoundColumnRefExpression>(col.Name(), col.Type(), binding);
		expressions.push_back(std::move(ref));
		physical_ids.push_back(col.Physical().index);
	}

	// Create an ART around the expressions.
	auto &io_manager = TableIOManager::Get(*this);
	auto art = make_uniq<ART>(index_info.name, type, physical_ids, io_manager, std::move(expressions), db, nullptr,
	                          index_info);
	info->indexes.AddIndex(std::move(art));
}